

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ep.c
# Opt level: O0

void nn_ep_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  nn_fsm *local_30;
  nn_ep *ep;
  void *srcptr_local;
  int type_local;
  int src_local;
  nn_fsm *self_local;
  
  local_30 = self;
  if (self == (nn_fsm *)0x0) {
    local_30 = (nn_fsm *)0x0;
  }
  if (*(int *)&local_30[1].fn != 1) {
    if (*(int *)&local_30[1].fn == 2) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)*(uint *)&local_30[1].fn,(ulong)(uint)src,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/core/ep.c"
              ,0xc4);
      fflush(_stderr);
      nn_err_abort();
    }
    fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
            (ulong)*(uint *)&local_30[1].fn,(ulong)(uint)src,(ulong)(uint)type,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/core/ep.c",
            0xca);
    fflush(_stderr);
    nn_err_abort();
  }
  if (src != -2) {
    fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
            (ulong)*(uint *)&local_30[1].fn,(ulong)(uint)src,(ulong)(uint)type,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/core/ep.c",
            0xbb);
    fflush(_stderr);
    nn_err_abort();
  }
  if (type != -2) {
    fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
            (ulong)*(uint *)&local_30[1].fn,0xfffffffe,(ulong)(uint)type,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/core/ep.c",
            0xb7);
    fflush(_stderr);
    nn_err_abort();
  }
  *(undefined4 *)&local_30[1].fn = 2;
  return;
}

Assistant:

static void nn_ep_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_ep *ep;

    ep = nn_cont (self, struct nn_ep, fsm);

    switch (ep->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_EP_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                ep->state = NN_EP_STATE_ACTIVE;
                return;
            default:
                nn_fsm_bad_action (ep->state, src, type);
            }

        default:
            nn_fsm_bad_source (ep->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/*  We don't expect any events in this state. The only thing that can be done */
/*  is closing the endpoint.                                                  */
/******************************************************************************/
    case NN_EP_STATE_ACTIVE:
        nn_fsm_bad_source (ep->state, src, type);

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (ep->state, src, type);
    }
}